

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O0

int LoadWebP(char *in_file,uint8_t **data,size_t *data_size,WebPBitstreamFeatures *bitstream)

{
  int iVar1;
  VP8StatusCode VVar2;
  char *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  WebPBitstreamFeatures local_features;
  VP8StatusCode status;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint8_t *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  iVar1 = ImgIoUtilReadFile(in_RCX,(uint8_t **)
                                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    VVar2 = WebPGetFeatures(in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (WebPBitstreamFeatures *)0x107c77);
    if (VVar2 == VP8_STATUS_OK) {
      local_4 = 1;
    }
    else {
      WebPFree((void *)0x107c8f);
      *in_RSI = 0;
      *in_RDX = 0;
      PrintWebPError((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int LoadWebP(const char* const in_file,
             const uint8_t** data, size_t* data_size,
             WebPBitstreamFeatures* bitstream) {
  VP8StatusCode status;
  WebPBitstreamFeatures local_features;
  if (!ImgIoUtilReadFile(in_file, data, data_size)) return 0;

  if (bitstream == NULL) {
    bitstream = &local_features;
  }

  status = WebPGetFeatures(*data, *data_size, bitstream);
  if (status != VP8_STATUS_OK) {
    WebPFree((void*)*data);
    *data = NULL;
    *data_size = 0;
    PrintWebPError(in_file, status);
    return 0;
  }
  return 1;
}